

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

void Curl_sasl_cleanup(connectdata *conn,unsigned_short authused)

{
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,authused) == 0x40) {
    Curl_auth_cleanup_ntlm(&conn->ntlm);
    return;
  }
  return;
}

Assistant:

void Curl_sasl_cleanup(struct connectdata *conn, unsigned short authused)
{
  (void)conn;
  (void)authused;

#if defined(USE_KERBEROS5)
  /* Cleanup the gssapi structure */
  if(authused == SASL_MECH_GSSAPI) {
    Curl_auth_cleanup_gssapi(&conn->krb5);
  }
#endif

#if defined(USE_GSASL)
  /* Cleanup the GSASL structure */
  if(authused & (SASL_MECH_SCRAM_SHA_1 | SASL_MECH_SCRAM_SHA_256)) {
    Curl_auth_gsasl_cleanup(&conn->gsasl);
  }
#endif

#if defined(USE_NTLM)
  /* Cleanup the NTLM structure */
  if(authused == SASL_MECH_NTLM) {
    Curl_auth_cleanup_ntlm(&conn->ntlm);
  }
#endif
}